

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::unspectate(clientinfo *ci)

{
  bool bVar1;
  clientinfo *ci_local;
  
  (ci->state).state = 1;
  gamestate::respawn(&ci->state);
  (ci->state).lasttimeplayed = lastmillis;
  aiman::addclient(ci);
  sendf(-1,1,"ri3",0x3e,(ulong)(uint)ci->clientnum,0);
  bVar1 = hasmap(ci);
  if (!bVar1) {
    rotatemap(true);
  }
  return;
}

Assistant:

extern void unspectate(clientinfo *ci)
    {
        ci->state.state = CS_DEAD;
        ci->state.respawn();
        ci->state.lasttimeplayed = lastmillis;
        aiman::addclient(ci);
        sendf(-1, 1, "ri3", N_SPECTATOR, ci->clientnum, 0);
        if(!hasmap(ci)) rotatemap(true);
        //should checkmaps
    }